

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_c99.c
# Opt level: O2

void test_s64(void)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  uVar2 = 0;
  lVar3 = SUB168((ZEXT816(0x10000000) << 0x40) % ZEXT816(0x3fffff87),0);
  bVar6 = 0x1fffffff < lVar3 - 0x1fffff88U;
  if (bVar6) {
    bVar1 = 0xdd;
    uVar2 = (ulong)(0x3fffff86 < (ulong)(lVar3 * 2));
  }
  else {
    bVar1 = 0x9c;
  }
  printf("Testing int64_t, %ld from %ld to %ld, step %ld\n",0xffffffffc0000079,0xffffffff800000f5,
         0xfffffe1c,0xbffff);
  bVar1 = bVar1 & 0x1d;
  lVar5 = 0x7fffff0b;
  for (lVar3 = -0x7fffff0b; lVar3 < 0xfffffe1c; lVar3 = lVar3 + 0xbffff) {
    if (uVar2 == 0xffffffffffffffff) {
      lVar4 = -1L << bVar1;
      if (-1 < lVar3) {
        lVar4 = -1;
      }
      lVar4 = (lVar4 + lVar5 >> bVar1) + 1;
    }
    else {
      lVar4 = 0;
      if (bVar6) {
        lVar4 = lVar3;
      }
      lVar4 = SUB168(SEXT816(lVar3) * SEXT816((long)~uVar2),8) - lVar4;
      lVar4 = (lVar4 >> bVar1) - (lVar4 >> 0x3f);
    }
    if (lVar4 != lVar3 / -0x3fffff87) {
      fprintf(_stderr,"Division fail: int64_t, %ld/%ld. Native: %ld, Libdivide %ld\n",lVar3,
              0xffffffffc0000079,lVar3 / -0x3fffff87);
    }
    lVar5 = lVar5 + -0xbffff;
  }
  return;
}

Assistant:

void test_s64(void) {
   int64_t denom =  -(((int64_t)2 << 29) - 121); // Prime - see https://primes.utm.edu/lists/2small/0bit.html
   struct libdivide_s64_t divider = libdivide_s64_gen(denom);
#define OP_S64(numer, divider) libdivide_s64_do(numer, &divider)
   TEST_BODY(int64_t, INT64_MAX, denom, divider, PRId64, OP_S64)
}